

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cpp
# Opt level: O1

void __thiscall IrSim::buildActive(IrSim *this)

{
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *p_Var1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *p_Var2;
  pointer piVar3;
  pointer pIVar4;
  long lVar5;
  Operand *op;
  long lVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  int blk;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *this_00;
  ulong uVar10;
  int local_4c;
  ulong local_48;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *local_40;
  long local_38;
  
  p_Var1 = &((this->use).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t;
  local_48 = ((long)(this->edges).
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->edges).
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  p_Var2 = &((this->use).
             super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->_M_t;
  this_00 = p_Var1;
  if (p_Var2 != p_Var1) {
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
      ::~_Rb_tree(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != p_Var2);
    (this->use).
    super__Vector_base<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var1;
  }
  iVar9 = (int)local_48;
  std::
  vector<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>_>
  ::resize(&this->use,(long)iVar9);
  if (0 < iVar9) {
    local_40 = &this->lastUsages;
    local_48 = (ulong)((uint)local_48 & 0x7fffffff);
    uVar10 = 0;
    do {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::clear(&local_40->_M_t);
      piVar3 = (this->basicBlocks).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar9 = piVar3[uVar10];
      lVar5 = (long)iVar9;
      iVar7 = piVar3[uVar10 + 1];
      lVar8 = (long)iVar7;
      if (iVar9 < iVar7) {
        lVar6 = lVar8 * 0x98 + -0x30;
        local_38 = lVar5;
        do {
          iVar7 = iVar7 + -1;
          pIVar4 = (this->irList).super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar9 = *(int *)((long)pIVar4 + lVar6 + -0x68);
          blk = (int)uVar10;
          if (iVar9 - 0x14U < 0xfffffff5) {
            op = (Operand *)((long)pIVar4 + lVar6 + -0x60);
            if (iVar9 == 8) {
              local_4c = iVar7;
              doSetUsage(this,op,blk,&local_4c);
            }
            else {
              doSetUsage(this,op,blk,(int *)0x0);
            }
            local_4c = iVar7;
            doSetUsage(this,(Operand *)
                            ((long)(this->irList).
                                   super__Vector_base<InterCode,_std::allocator<InterCode>_>._M_impl
                                   .super__Vector_impl_data._M_start + lVar6 + -0x30),blk,&local_4c)
            ;
            local_4c = iVar7;
            doSetUsage(this,(Operand *)
                            ((long)&((this->irList).
                                     super__Vector_base<InterCode,_std::allocator<InterCode>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->kind + lVar6),blk,
                       &local_4c);
            lVar5 = local_38;
          }
          else if ((iVar9 - 9U < 4) || (iVar9 == 0x13)) {
            local_4c = iVar7;
            doSetUsage(this,(Operand *)((long)pIVar4 + lVar6 + -0x60),blk,&local_4c);
          }
          lVar8 = lVar8 + -1;
          lVar6 = lVar6 + -0x98;
        } while (lVar5 < lVar8);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_48);
  }
  return;
}

Assistant:

void IrSim::buildActive() {
    int size = (int)edges.size();
    use.clear();
//    lastUsages.clear();
    use.resize((size_t)size);
    for (int i = 0; i < size; ++i) {
        lastUsages.clear();
        for (int j = (int) basicBlocks[i], k = (int) basicBlocks[i + 1] - 1; k >= j; --k) {
            int kind = irList[k].kind;
            if (kind < IC_NONVAR || kind > IC_NONVAR_LAST) {
                if (kind != IC_DEREF_L)
                    unsetUsage(irList[k][0], i);
                else
                    setUsage(irList[k][0], i, k);
                setUsage(irList[k][1], i, k);
                setUsage(irList[k][2], i ,k);
            }
            else if (kind == IC_WRITE || kind == IC_ARG || kind == IC_ARGADDR || kind == IC_RETURN || kind == IC_CALL) {
                setUsage(irList[k][0], i, k);
            }
        }
    }
}